

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O3

void __thiscall
tcu::TestSessionExecutor::leaveTestCase(TestSessionExecutor *this,TestCase *testCase)

{
  int *piVar1;
  bool bVar2;
  qpTestResult result;
  deUint64 dVar3;
  TestLog *this_00;
  TestContext *pTVar4;
  char *description;
  qpWatchDog *dog;
  deUint64 dVar5;
  char *pcVar6;
  string local_210;
  string local_1f0;
  string local_1d0;
  LogNumber<long> local_1b0 [3];
  
  (*((this->m_caseExecutor).
     super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.m_data.ptr)
    ->_vptr_TestCaseExecutor[3])();
  dVar5 = deGetMicroseconds();
  dVar3 = this->m_testStartTime;
  this->m_testStartTime = 0;
  this_00 = this->m_testCtx->m_log;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"TestDuration","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"Test case duration in microseconds","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"us","");
  LogNumber<long>::LogNumber
            (local_1b0,&local_1d0,&local_1f0,&local_210,QP_KEY_TAG_TIME,dVar5 - dVar3);
  TestLog::writeInteger
            (this_00,local_1b0[0].m_name._M_dataplus._M_p,local_1b0[0].m_desc._M_dataplus._M_p,
             local_1b0[0].m_unit._M_dataplus._M_p,local_1b0[0].m_tag,local_1b0[0].m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0].m_unit._M_dataplus._M_p != &local_1b0[0].m_unit.field_2) {
    operator_delete(local_1b0[0].m_unit._M_dataplus._M_p,
                    local_1b0[0].m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0].m_desc._M_dataplus._M_p != &local_1b0[0].m_desc.field_2) {
    operator_delete(local_1b0[0].m_desc._M_dataplus._M_p,
                    local_1b0[0].m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0].m_name._M_dataplus._M_p != &local_1b0[0].m_name.field_2) {
    operator_delete(local_1b0[0].m_name._M_dataplus._M_p,
                    local_1b0[0].m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = this->m_testCtx;
  result = pTVar4->m_testResult;
  description = (pTVar4->m_testResultDesc)._M_dataplus._M_p;
  bVar2 = pTVar4->m_terminateAfter;
  this->m_isInTestCase = false;
  TestLog::endCase(pTVar4->m_log,result,description);
  pcVar6 = qpGetTestResultName(result);
  tcu::print("  %s (%s)\n",pcVar6,description);
  (this->m_status).numExecuted = (this->m_status).numExecuted + 1;
  switch(result) {
  case QP_TEST_RESULT_PASS:
    piVar1 = &(this->m_status).numPassed;
    *piVar1 = *piVar1 + 1;
    break;
  default:
    piVar1 = &(this->m_status).numFailed;
    *piVar1 = *piVar1 + 1;
    break;
  case QP_TEST_RESULT_QUALITY_WARNING:
  case QP_TEST_RESULT_COMPATIBILITY_WARNING:
    piVar1 = &(this->m_status).numWarnings;
    *piVar1 = *piVar1 + 1;
    break;
  case QP_TEST_RESULT_NOT_SUPPORTED:
    piVar1 = &(this->m_status).numNotSupported;
    *piVar1 = *piVar1 + 1;
  }
  if ((result == QP_TEST_RESULT_RESOURCE_ERROR) || (bVar2 != false)) {
    this->m_abortSession = true;
  }
  dog = this->m_testCtx->m_watchDog;
  if (dog != (qpWatchDog *)0x0) {
    qpWatchDog_reset(dog);
  }
  return;
}

Assistant:

void TestSessionExecutor::leaveTestCase (TestCase* testCase)
{
	TestLog&	log		= m_testCtx.getLog();

	// De-init case.
	try
	{
		m_caseExecutor->deinit(testCase);
	}
	catch (const tcu::Exception& e)
	{
		log << e << TestLog::Message << "Error in test case deinit, test program will terminate." << TestLog::EndMessage;
		m_testCtx.setTerminateAfter(true);
	}

	{
		const deInt64 duration = deGetMicroseconds()-m_testStartTime;
		m_testStartTime = 0;
		m_testCtx.getLog() << TestLog::Integer("TestDuration", "Test case duration in microseconds", "us", QP_KEY_TAG_TIME, duration);
	}

	{
		const qpTestResult	testResult		= m_testCtx.getTestResult();
		const char* const	testResultDesc	= m_testCtx.getTestResultDesc();
		const bool			terminateAfter	= m_testCtx.getTerminateAfter();
		DE_ASSERT(testResult != QP_TEST_RESULT_LAST);

		m_isInTestCase = false;
		m_testCtx.getLog().endCase(testResult, testResultDesc);

		// Update statistics.
		print("  %s (%s)\n", qpGetTestResultName(testResult), testResultDesc);

		m_status.numExecuted += 1;
		switch (testResult)
		{
			case QP_TEST_RESULT_PASS:					m_status.numPassed			+= 1;	break;
			case QP_TEST_RESULT_NOT_SUPPORTED:			m_status.numNotSupported	+= 1;	break;
			case QP_TEST_RESULT_QUALITY_WARNING:		m_status.numWarnings		+= 1;	break;
			case QP_TEST_RESULT_COMPATIBILITY_WARNING:	m_status.numWarnings		+= 1;	break;
			default:									m_status.numFailed			+= 1;	break;
		}

		// terminateAfter, Resource error or any error in deinit means that execution should end
		if (terminateAfter || testResult == QP_TEST_RESULT_RESOURCE_ERROR)
			m_abortSession = true;
	}

	if (m_testCtx.getWatchDog())
		qpWatchDog_reset(m_testCtx.getWatchDog());
}